

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CClient.cpp
# Opt level: O0

string * __thiscall CClient::GetUserDir_abi_cxx11_(string *__return_storage_ptr__,CClient *this)

{
  CClient *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_RootDir);
  return __return_storage_ptr__;
}

Assistant:

string CClient::GetUserDir() const{
    return m_RootDir;
}